

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::Track::Info::Clear(Info *this)

{
  if (this->nameAsUTF8 != (char *)0x0) {
    operator_delete__(this->nameAsUTF8);
  }
  this->nameAsUTF8 = (char *)0x0;
  if (this->language != (char *)0x0) {
    operator_delete__(this->language);
  }
  this->language = (char *)0x0;
  if (this->codecId != (char *)0x0) {
    operator_delete__(this->codecId);
  }
  this->codecId = (char *)0x0;
  if (this->codecPrivate != (uchar *)0x0) {
    operator_delete__(this->codecPrivate);
  }
  this->codecPrivate = (uchar *)0x0;
  this->codecPrivateSize = 0;
  if (this->codecNameAsUTF8 != (char *)0x0) {
    operator_delete__(this->codecNameAsUTF8);
  }
  this->codecNameAsUTF8 = (char *)0x0;
  return;
}

Assistant:

void Track::Info::Clear() {
  delete[] nameAsUTF8;
  nameAsUTF8 = NULL;

  delete[] language;
  language = NULL;

  delete[] codecId;
  codecId = NULL;

  delete[] codecPrivate;
  codecPrivate = NULL;
  codecPrivateSize = 0;

  delete[] codecNameAsUTF8;
  codecNameAsUTF8 = NULL;
}